

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<ArenaVector<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          ArenaVector<wasm::Expression_*> *list)

{
  ulong uVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  ArenaVector<wasm::Expression_*> *__range2;
  
  uVar1 = (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements;
  if (*(ulong *)(this + 0x10) < uVar1) {
    *(ulong *)(this + 0x10) = uVar1;
    pvVar3 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),uVar1 * 8,8);
    *(void **)this = pvVar3;
  }
  sVar2 = (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
          usedElements;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      *(Expression **)(*(long *)this + sVar4 * 8) =
           (list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           [sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  *(ulong *)(this + 8) = uVar1;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }